

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O1

vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> * __thiscall
cfd::core::Transaction::GetTxInList
          (vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>
           *__return_storage_ptr__,Transaction *this)

{
  pointer pTVar1;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *__x;
  pointer pTVar2;
  TxIn tx_in;
  AbstractTxIn local_150;
  AbstractTxInReference local_c0;
  
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar2 = (this->vin_).super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pTVar1 = (this->vin_).super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pTVar2 != pTVar1) {
    __x = &(pTVar2->super_AbstractTxIn).script_witness_.witness_stack_;
    do {
      local_150._vptr_AbstractTxIn = (_func_int **)&PTR__AbstractTxIn_007397c8;
      Txid::Txid(&local_150.txid_,(Txid *)((long)(__x + -5) + 8));
      local_150.vout_ = *(uint32_t *)((long)(__x + -4) + 0x10);
      Script::Script(&local_150.unlocking_script_,(Script *)(__x + -3));
      local_150.sequence_ = *(uint32_t *)((long)(__x + -1) + 8);
      local_150.script_witness_._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_00735628;
      ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
                (&local_150.script_witness_.witness_stack_,__x);
      local_150._vptr_AbstractTxIn = (_func_int **)&PTR__AbstractTxIn_007408e8;
      AbstractTxInReference::AbstractTxInReference(&local_c0,&local_150);
      local_c0._vptr_AbstractTxInReference = (_func_int **)&PTR__AbstractTxInReference_00740908;
      ::std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>::
      emplace_back<cfd::core::TxInReference>(__return_storage_ptr__,(TxInReference *)&local_c0);
      AbstractTxInReference::~AbstractTxInReference(&local_c0);
      AbstractTxIn::~AbstractTxIn(&local_150);
      pTVar2 = (pointer)(__x + 1);
      __x = __x + 6;
    } while (pTVar2 != pTVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::vector<TxInReference> Transaction::GetTxInList() const {
  std::vector<TxInReference> refs;
  for (TxIn tx_in : vin_) {
    refs.push_back(TxInReference(tx_in));
  }
  return refs;
}